

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stream.cpp
# Opt level: O1

void __thiscall lambda_sum_Test::TestBody(lambda_sum_Test *this)

{
  pointer piVar1;
  int init;
  int *piVar2;
  int iVar3;
  char *message;
  bool bVar4;
  initializer_list<int> __l;
  AssertionResult gtest_ar;
  allocator_type local_85;
  int local_84;
  vector<int,_std::allocator<int>_> local_80;
  int *local_68;
  int *local_60;
  internal local_58 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  vector<int,_std::allocator<int>_> local_48;
  int local_2c;
  AssertHelper local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined4 local_10;
  
  local_84 = 0x1f;
  local_28.data_ = (AssertHelperData *)&DAT_200000001;
  uStack_20 = 0x400000003;
  local_18 = 0x700000006;
  local_10 = 8;
  __l._M_len = 7;
  __l._M_array = (iterator)&local_28;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,__l,&local_85);
  std::vector<int,_std::allocator<int>_>::vector(&local_80,&local_48);
  local_68 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  local_60 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  piVar1 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_2c = lambda::streams::sum;
  do {
    if (piVar1 == local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      iVar3 = 0;
      piVar2 = piVar1;
    }
    else {
      local_68 = piVar1 + 1;
      iVar3 = *piVar1;
      piVar2 = local_68;
    }
    local_2c = local_2c + iVar3;
    bVar4 = piVar1 != local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
    piVar1 = piVar2;
  } while (bVar4);
  testing::internal::CmpHelperEQ<int,int>
            (local_58,"31","stream(vector(1, 2, 3, 4, 6, 7, 8)) | sum",&local_84,&local_2c);
  if ((long *)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (long *)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/test/test_stream.cpp"
               ,0x17,message);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((long *)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (long *)0x0)) {
        (**(code **)(*(long *)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + 8))();
      }
      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(lambda, sum) { ASSERT_EQ(31, stream(vector(1, 2, 3, 4, 6, 7, 8)) | sum); }